

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * ghc::filesystem::read_symlink(path *__return_storage_ptr__,path *p,error_code *ec)

{
  int iVar1;
  int *piVar2;
  error_category *peVar3;
  path result;
  stat local_b0;
  
  iVar1 = lstat((p->_path)._M_dataplus._M_p,&local_b0);
  if (iVar1 == 0) {
    peVar3 = (error_category *)std::_V2::system_category();
    ec->_M_value = 0;
    ec->_M_cat = peVar3;
    if ((local_b0.st_mode & 0xf000) == 0xa000) {
      detail::resolveSymlink((path *)&local_b0,p,ec);
      iVar1 = ec->_M_value;
      (__return_storage_ptr__->_path)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->_path).field_2;
      if (iVar1 == 0) {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,local_b0.st_dev,
                   (undefined1 *)(local_b0.st_dev + local_b0.st_ino));
      }
      else {
        (__return_storage_ptr__->_path)._M_string_length = 0;
        (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
      }
      if ((__nlink_t *)local_b0.st_dev == &local_b0.st_nlink) {
        return __return_storage_ptr__;
      }
      operator_delete((void *)local_b0.st_dev);
      return __return_storage_ptr__;
    }
  }
  else {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    peVar3 = (error_category *)std::_V2::system_category();
    ec->_M_value = iVar1;
    ec->_M_cat = peVar3;
  }
  peVar3 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0x16;
  ec->_M_cat = peVar3;
  (__return_storage_ptr__->_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_string_length = 0;
  (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path read_symlink(const path& p, std::error_code& ec)
{
    file_status fs = symlink_status(p, ec);
    if (fs.type() != file_type::symlink) {
        ec = detail::make_error_code(detail::portable_error::invalid_argument);
        return path();
    }
    auto result = detail::resolveSymlink(p, ec);
    return ec ? path() : result;
}